

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

void __thiscall exec_node::insert_after(exec_node *this,exec_list *after)

{
  exec_node *peVar1;
  exec_node *peVar2;
  
  if ((after->head_sentinel).next != &after->tail_sentinel) {
    peVar1 = this->next;
    ((after->tail_sentinel).prev)->next = peVar1;
    peVar2 = (after->head_sentinel).next;
    peVar2->prev = this;
    peVar1->prev = (after->tail_sentinel).prev;
    this->next = peVar2;
    (after->head_sentinel).next = &after->tail_sentinel;
    (after->head_sentinel).prev = (exec_node *)0x0;
    (after->tail_sentinel).next = (exec_node *)0x0;
    (after->tail_sentinel).prev = &after->head_sentinel;
  }
  return;
}

Assistant:

static inline bool
exec_list_is_empty(const struct exec_list *list)
{
   /* There are three ways to test whether a list is empty or not.
    *
    * - Check to see if the head sentinel's \c next is the tail sentinel.
    * - Check to see if the tail sentinel's \c prev is the head sentinel.
    * - Check to see if the head is the sentinel node by test whether its
    *   \c next pointer is \c NULL.
    *
    * The first two methods tend to generate better code on modern systems
    * because they save a pointer dereference.
    */
   return list->head_sentinel.next == &list->tail_sentinel;
}